

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarManStop(Ssw_RarMan_t *p)

{
  Ssw_RarMan_t *p_local;
  
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x313,"void Ssw_RarManStop(Ssw_RarMan_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  if (p->ppClasses != (Ssw_Cla_t *)0x0) {
    Ssw_ClassesStop(p->ppClasses);
  }
  Vec_IntFreeP(&p->vInits);
  Vec_IntFreeP(&p->vPatBests);
  Vec_PtrFreeP(&p->vUpdConst);
  Vec_PtrFreeP(&p->vUpdClass);
  if (p->pObjData != (word *)0x0) {
    free(p->pObjData);
    p->pObjData = (word *)0x0;
  }
  if (p->pPatData != (word *)0x0) {
    free(p->pPatData);
    p->pPatData = (word *)0x0;
  }
  if (p->pPatCosts != (double *)0x0) {
    free(p->pPatCosts);
    p->pPatCosts = (double *)0x0;
  }
  if (p->pRarity != (int *)0x0) {
    free(p->pRarity);
    p->pRarity = (int *)0x0;
  }
  if (p != (Ssw_RarMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static void Ssw_RarManStop( Ssw_RarMan_t * p )
{
//    Vec_PtrFreeP( &p->vCexes );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
    if ( p->ppClasses ) Ssw_ClassesStop( p->ppClasses );
    Vec_IntFreeP( &p->vInits );
    Vec_IntFreeP( &p->vPatBests );
    Vec_PtrFreeP( &p->vUpdConst );
    Vec_PtrFreeP( &p->vUpdClass );
    ABC_FREE( p->pObjData );
    ABC_FREE( p->pPatData );
    ABC_FREE( p->pPatCosts );
    ABC_FREE( p->pRarity );
    ABC_FREE( p );
}